

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int walk_directory(CPUMIPSState_conflict2 *env,uint64_t *vaddr,int directory_index,_Bool *huge_page,
                  _Bool *hgpg_directory_hit,uint64_t *pw_entrylo0,uint64_t *pw_entrylo1)

{
  ulong *puVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong *puVar6;
  int mmu_idx;
  byte bVar7;
  uint access_type;
  ulong uVar8;
  uint entry_size;
  ulong vaddr_00;
  ulong local_70;
  ulong local_68;
  uint local_60;
  int prot;
  ulong *local_58;
  ulong local_50;
  _Bool *local_48;
  _Bool *local_40;
  uint64_t paddr;
  
  local_68 = (ulong)(uint)env->CP0_PWCtl;
  uVar3 = env->CP0_PWSize & 0x3f;
  iVar4 = ((env->CP0_PWSize >> 0x1e & 1) != 0) + 2;
  bVar7 = (byte)((uint)env->CP0_PWCtl >> 6);
  if (uVar3 < 2) {
    mmu_idx = (uint)(uVar3 == 1 & bVar7) + iVar4 + 3;
  }
  else {
    mmu_idx = 2;
  }
  uVar8 = 0xffffffff;
  if (uVar3 < 2) {
    uVar8 = (ulong)(iVar4 + (uint)(uVar3 == 1));
  }
  local_50 = (ulong)env->CP0_PWField;
  entry_size = 1 << ((byte)uVar8 + 3 & 0x1f);
  uVar3 = env->hflags & 3;
  if ((env->hflags >> 0x1c & 1) != 0) {
    uVar3 = 3;
  }
  local_60 = directory_index;
  local_58 = pw_entrylo0;
  local_48 = huge_page;
  local_40 = hgpg_directory_hit;
  iVar4 = get_physical_address(env,&paddr,&prot,(target_ulong_conflict)*vaddr,0,uVar3,mmu_idx);
  if ((iVar4 == 0) &&
     (_Var2 = get_pte(env,*vaddr,1 << (sbyte)mmu_idx,&local_70), puVar1 = local_58, _Var2)) {
    if ((bVar7 & (local_70 >> ((uint)local_68 & 0x3f) & 1) != 0) != 1) {
      *vaddr = local_70;
      return 2;
    }
    uVar5 = (uint)local_50 & 0x3f;
    uVar3 = uVar5 - 0x20;
    if (uVar5 <= entry_size) {
      uVar3 = uVar5;
    }
    local_70 = local_70 >> ((byte)(uVar3 - 2) & 0x3f);
    *local_48 = true;
    *local_40 = true;
    local_70 = (ulong)(uint)((int)local_70 << 0x1e) | local_70 >> 2;
    if ((local_60 & 1) != 0) {
      uVar8 = (ulong)((uint)(1 << ((char)local_60 - 1U & 0x1f)) >> 6);
      *local_58 = ~uVar8 & local_70;
      *pw_entrylo1 = local_70 | uVar8;
      return 1;
    }
    if (-1 < (char)local_68) {
      return 0;
    }
    uVar5 = 1 << ((byte)uVar8 & 0x1f);
    vaddr_00 = *vaddr ^ (ulong)uVar5;
    puVar6 = pw_entrylo1;
    if ((*vaddr >> (uVar8 & 0x3f) & 1) == 0) {
      puVar6 = local_58;
    }
    *puVar6 = local_70;
    access_type = 3;
    if ((env->hflags >> 0x1c & 1) == 0) {
      access_type = env->hflags & 3;
    }
    local_68 = (ulong)(uVar3 - 2);
    iVar4 = get_physical_address
                      (env,&paddr,&prot,(target_ulong_conflict)vaddr_00,0,access_type,(int)vaddr);
    if (iVar4 == 0) {
      _Var2 = get_pte(env,vaddr_00,entry_size,&local_70);
      if (!_Var2) {
        return 0;
      }
      local_70 = local_70 >> ((byte)local_68 & 0x3f);
      uVar8 = (ulong)(uint)((int)local_70 << 0x1e) | local_70 >> 2;
      if (((uint)*vaddr & uVar5) == 0) {
        *pw_entrylo1 = uVar8;
      }
      else {
        *puVar1 = uVar8;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int walk_directory(CPUMIPSState *env, uint64_t *vaddr,
        int directory_index, bool *huge_page, bool *hgpg_directory_hit,
        uint64_t *pw_entrylo0, uint64_t *pw_entrylo1)
{
    int dph = (env->CP0_PWCtl >> CP0PC_DPH) & 0x1;
    int psn = (env->CP0_PWCtl >> CP0PC_PSN) & 0x3F;
    int hugepg = (env->CP0_PWCtl >> CP0PC_HUGEPG) & 0x1;
    int pf_ptew = (env->CP0_PWField >> CP0PF_PTEW) & 0x3F;
    int ptew = (env->CP0_PWSize >> CP0PS_PTEW) & 0x3F;
    int native_shift = (((env->CP0_PWSize >> CP0PS_PS) & 1) == 0) ? 2 : 3;
    int directory_shift = (ptew > 1) ? -1 :
            (hugepg && (ptew == 1)) ? native_shift + 1 : native_shift;
    int leaf_shift = (ptew > 1) ? -1 :
            (ptew == 1) ? native_shift + 1 : native_shift;
    uint32_t direntry_size = 1 << (directory_shift + 3);
    uint32_t leafentry_size = 1 << (leaf_shift + 3);
    uint64_t entry;
    uint64_t paddr;
    int prot;
    uint64_t lsb = 0;
    uint64_t w = 0;

    if (get_physical_address(env, &paddr, &prot, *vaddr, MMU_DATA_LOAD,
                             ACCESS_INT, cpu_mmu_index(env, false)) !=
                             TLBRET_MATCH) {
        /* wrong base address */
        return 0;
    }
    if (!get_pte(env, *vaddr, direntry_size, &entry)) {
        return 0;
    }

    if ((entry & (1ULL << psn)) && hugepg) {
        *huge_page = true;
        *hgpg_directory_hit = true;
        entry = get_tlb_entry_layout(env, entry, leafentry_size, pf_ptew);
        w = directory_index - 1;
        if (directory_index & 0x1) {
            /* Generate adjacent page from same PTE for odd TLB page */
            lsb = (1 << w) >> 6;
            *pw_entrylo0 = entry & ~lsb; /* even page */
            *pw_entrylo1 = entry | lsb; /* odd page */
        } else if (dph) {
            int oddpagebit = 1 << leaf_shift;
            uint64_t vaddr2 = *vaddr ^ oddpagebit;
            if (*vaddr & oddpagebit) {
                *pw_entrylo1 = entry;
            } else {
                *pw_entrylo0 = entry;
            }
            if (get_physical_address(env, &paddr, &prot, vaddr2, MMU_DATA_LOAD,
                                     ACCESS_INT, cpu_mmu_index(env, false)) !=
                                     TLBRET_MATCH) {
                return 0;
            }
            if (!get_pte(env, vaddr2, leafentry_size, &entry)) {
                return 0;
            }
            entry = get_tlb_entry_layout(env, entry, leafentry_size, pf_ptew);
            if (*vaddr & oddpagebit) {
                *pw_entrylo0 = entry;
            } else {
                *pw_entrylo1 = entry;
            }
        } else {
            return 0;
        }
        return 1;
    } else {
        *vaddr = entry;
        return 2;
    }
}